

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O0

void multikey_simd_b_1(uchar **strings,size_t n)

{
  uchar **__ptr;
  int iVar1;
  uchar **sorted_00;
  uint8_t *oracle;
  uchar **sorted;
  size_t n_local;
  uchar **strings_local;
  undefined8 local_28;
  size_t local_20;
  uchar **local_18;
  uchar **local_10;
  
  sorted_00 = (uchar **)malloc(n << 3);
  local_28 = 0x10;
  local_20 = n;
  iVar1 = posix_memalign(&strings_local,0x10,n);
  if (iVar1 == 0) {
    local_18 = strings_local;
  }
  else {
    local_18 = (uchar **)0x0;
  }
  __ptr = local_18;
  multikey_simd_b<unsigned_char>(strings,n,0,sorted_00,(uint8_t *)local_18);
  local_10 = __ptr;
  free(__ptr);
  free(sorted_00);
  return;
}

Assistant:

void multikey_simd_b_1(unsigned char** strings, size_t n)
{
	unsigned char** sorted =
		static_cast<unsigned char**>(malloc(n*sizeof(unsigned char*)));
	uint8_t* const restrict oracle =
		static_cast<uint8_t*>(_mm_malloc(n, 16));
	multikey_simd_b<unsigned char>(strings, n, 0, sorted, oracle);
	_mm_free(oracle);
	free(sorted);
}